

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O0

void __thiscall icu_63::DecimalFormat::DecimalFormat(DecimalFormat *this,DecimalFormat *source)

{
  bool bVar1;
  DecimalFormatFields *pDVar2;
  DecimalFormatProperties *pDVar3;
  DecimalFormatProperties *pDVar4;
  DecimalFormatSymbols *this_00;
  DecimalFormatSymbols *source_00;
  DecimalFormat *size;
  DecimalFormatProperties *local_c0;
  DecimalFormatSymbols *local_a0;
  DecimalFormatProperties *local_80;
  DecimalFormatFields *local_68;
  DecimalFormat *source_local;
  DecimalFormat *this_local;
  
  size = source;
  NumberFormat::NumberFormat(&this->super_NumberFormat,&source->super_NumberFormat);
  (this->super_NumberFormat).super_Format.super_UObject._vptr_UObject =
       (_func_int **)&PTR__DecimalFormat_005bd010;
  pDVar2 = (DecimalFormatFields *)UMemory::operator_new((UMemory *)0x8a8,(size_t)size);
  local_68 = (DecimalFormatFields *)0x0;
  if (pDVar2 != (DecimalFormatFields *)0x0) {
    size = (DecimalFormat *)0x0;
    memset(pDVar2,0,0x8a8);
    icu_63::number::impl::DecimalFormatFields::DecimalFormatFields(pDVar2);
    local_68 = pDVar2;
  }
  this->fields = local_68;
  if (this->fields != (DecimalFormatFields *)0x0) {
    pDVar2 = this->fields;
    pDVar3 = (DecimalFormatProperties *)UMemory::operator_new((UMemory *)0x2f8,(size_t)size);
    local_80 = (DecimalFormatProperties *)0x0;
    if (pDVar3 != (DecimalFormatProperties *)0x0) {
      pDVar4 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator*
                         ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                          source->fields);
      icu_63::number::impl::DecimalFormatProperties::DecimalFormatProperties(pDVar3,pDVar4);
      local_80 = pDVar3;
    }
    LocalPointer<icu_63::number::impl::DecimalFormatProperties>::adoptInstead
              (&pDVar2->properties,local_80);
    pDVar2 = this->fields;
    this_00 = (DecimalFormatSymbols *)UMemory::operator_new((UMemory *)0xb00,(size_t)local_80);
    local_a0 = (DecimalFormatSymbols *)0x0;
    if (this_00 != (DecimalFormatSymbols *)0x0) {
      source_00 = LocalPointerBase<const_icu_63::DecimalFormatSymbols>::operator*
                            (&(source->fields->symbols).
                              super_LocalPointerBase<const_icu_63::DecimalFormatSymbols>);
      DecimalFormatSymbols::DecimalFormatSymbols(this_00,source_00);
      local_a0 = this_00;
    }
    LocalPointer<const_icu_63::DecimalFormatSymbols>::adoptInstead(&pDVar2->symbols,local_a0);
    pDVar2 = this->fields;
    pDVar3 = (DecimalFormatProperties *)UMemory::operator_new((UMemory *)0x2f8,(size_t)local_a0);
    local_c0 = (DecimalFormatProperties *)0x0;
    if (pDVar3 != (DecimalFormatProperties *)0x0) {
      icu_63::number::impl::DecimalFormatProperties::DecimalFormatProperties(pDVar3);
      local_c0 = pDVar3;
    }
    LocalPointer<icu_63::number::impl::DecimalFormatProperties>::adoptInstead
              (&pDVar2->exportedProperties,local_c0);
    bVar1 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator==
                      ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                       this->fields,(DecimalFormatProperties *)0x0);
    if (((!bVar1) &&
        (bVar1 = LocalPointerBase<const_icu_63::DecimalFormatSymbols>::operator==
                           (&(this->fields->symbols).
                             super_LocalPointerBase<const_icu_63::DecimalFormatSymbols>,
                            (DecimalFormatSymbols *)0x0), !bVar1)) &&
       (bVar1 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator==
                          (&(this->fields->exportedProperties).
                            super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>,
                           (DecimalFormatProperties *)0x0), !bVar1)) {
      touchNoError(this);
    }
  }
  return;
}

Assistant:

DecimalFormat::DecimalFormat(const DecimalFormat& source) : NumberFormat(source) {
    // Note: it is not safe to copy fields->formatter or fWarehouse directly because fields->formatter might have
    // dangling pointers to fields inside fWarehouse. The safe thing is to re-construct fields->formatter from
    // the property bag, despite being somewhat slower.
    fields = new DecimalFormatFields();
    if (fields == nullptr) {
        return;
    }
    fields->properties.adoptInstead(new DecimalFormatProperties(*source.fields->properties));
    fields->symbols.adoptInstead(new DecimalFormatSymbols(*source.fields->symbols));
    fields->exportedProperties.adoptInstead(new DecimalFormatProperties());
    if (fields->properties == nullptr || fields->symbols == nullptr || fields->exportedProperties == nullptr) {
        return;
    }
    touchNoError();
}